

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc.c
# Opt level: O0

void vorbis_lpc_predict(float *coeff,float *prime,int m,float *data,long n)

{
  long lVar1;
  float afStack_68 [4];
  float *work;
  long lStack_50;
  float y;
  long p;
  long o;
  long j;
  long i;
  long n_local;
  float *data_local;
  int m_local;
  float *prime_local;
  float *coeff_local;
  
  lVar1 = -0x68 - ((m + n) * 4 + 0xfU & 0xfffffffffffffff0);
  if (prime == (float *)0x0) {
    for (j = 0; j < m; j = j + 1) {
      *(undefined4 *)((long)afStack_68 + j * 4 + lVar1 + 0x68) = 0;
    }
  }
  else {
    for (j = 0; j < m; j = j + 1) {
      *(float *)((long)afStack_68 + j * 4 + lVar1 + 0x68) = prime[j];
    }
  }
  for (j = 0; j < n; j = j + 1) {
    work._4_4_ = 0.0;
    p = j;
    lStack_50 = (long)m;
    for (o = 0; o < m; o = o + 1) {
      work._4_4_ = work._4_4_ -
                   *(float *)((long)afStack_68 + p * 4 + lVar1 + 0x68) * coeff[lStack_50 + -1];
      lStack_50 = lStack_50 + -1;
      p = p + 1;
    }
    *(float *)((long)afStack_68 + p * 4 + lVar1 + 0x68) = work._4_4_;
    data[j] = work._4_4_;
  }
  return;
}

Assistant:

void vorbis_lpc_predict(float *coeff,float *prime,int m,
                     float *data,long n){

  /* in: coeff[0...m-1] LPC coefficients
         prime[0...m-1] initial values (allocated size of n+m-1)
    out: data[0...n-1] data samples */

  long i,j,o,p;
  float y;
  float *work=alloca(sizeof(*work)*(m+n));

  if(!prime)
    for(i=0;i<m;i++)
      work[i]=0.f;
  else
    for(i=0;i<m;i++)
      work[i]=prime[i];

  for(i=0;i<n;i++){
    y=0;
    o=i;
    p=m;
    for(j=0;j<m;j++)
      y-=work[o++]*coeff[--p];

    data[i]=work[o]=y;
  }
}